

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

int __thiscall
chrono::ChSystemDescriptor::FromVariablesToVector
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector,bool resize_vector)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChVariables *pCVar3;
  int iVar4;
  int n;
  undefined7 in_register_00000011;
  size_t iv;
  long lVar5;
  ChVectorRef local_80;
  Type local_68;
  
  if ((int)CONCAT71(in_register_00000011,resize_vector) != 0) {
    iVar4 = (*this->_vptr_ChSystemDescriptor[7])(this);
    this->n_q = iVar4;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar4)
    ;
  }
  ppCVar1 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar2 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = 0; (long)ppCVar1 - (long)ppCVar2 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    pCVar3 = (this->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar5];
    if (pCVar3->disabled == false) {
      ChVariables::Get_qb(&local_80,pCVar3);
      pCVar3 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar5];
      iVar4 = pCVar3->offset;
      n = (*pCVar3->_vptr_ChVariables[2])();
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)mvector,(long)iVar4
                 ,n);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
                 &local_80);
    }
  }
  return this->n_q;
}

Assistant:

int ChSystemDescriptor::FromVariablesToVector(ChVectorDynamic<>& mvector, bool resize_vector) {
    // Count active variables and resize vector if necessary
    if (resize_vector) {
        n_q = CountActiveVariables();
        mvector.setZero(n_q);
    }

    // Fill the vector
    auto vv_size = vvariables.size();
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            mvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_qb();
        }
    }

    return n_q;
}